

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CZ<std::complex<double>_>::CZ
          (CZ<std::complex<double>_> *this,int control,int target,int controlState)

{
  PauliZ<std::complex<double>_> *pPVar1;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_00135498;
  pPVar1 = (PauliZ<std::complex<double>_> *)operator_new(0x10);
  (pPVar1->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00134c90;
  (pPVar1->super_QGate1<std::complex<double>_>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
                 );
  }
  (pPVar1->super_QGate1<std::complex<double>_>).super_QObject<std::complex<double>_> =
       (QObject<std::complex<double>_>)&PTR_nbQubits_00134e58;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<std::complex<double>_>,_std::default_delete<qclab::qgates::PauliZ<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::PauliZ<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<std::complex<double>_>_*,_false>._M_head_impl =
       pPVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                  ,0x2c,
                  "qclab::qgates::CZ<std::complex<double>>::CZ(const int, const int, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/qgates/CZ.hpp"
                ,0x2b,
                "qclab::qgates::CZ<std::complex<double>>::CZ(const int, const int, const int) [T = std::complex<double>]"
               );
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }